

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O0

JsTTDStreamHandle
Helpers::TTCreateStreamCallback
          (size_t uriLength,char *uri,size_t asciiNameLength,char *asciiName,bool read,bool write)

{
  PAL_FILE *pPVar1;
  JsTTDStreamHandle pvVar2;
  JsTTDStreamHandle res;
  char path [512];
  bool write_local;
  bool read_local;
  char *asciiName_local;
  size_t asciiNameLength_local;
  char *uri_local;
  size_t uriLength_local;
  
  if (((read || write) & ((read ^ 0xffU) & 1 | (write ^ 0xffU) & 1)) == 0) {
    pPVar1 = PAL_get_stderr(0);
    PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Helpers.cpp"
                ,0x256,"(read | write) & (!read | !write)",
                "Read/Write streams not supported yet -- defaulting to read only");
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    DebugBreak();
  }
  if (0x200 < uriLength + asciiNameLength + 1) {
    PAL_wprintf(L"We assume bounded MAX_URI_LENGTH for simplicity.");
    PAL_exit(1);
  }
  memset(&res,0,0x200);
  memcpy_s(&res,0x200,uri,uriLength);
  memcpy_s(path + (uriLength - 8),0x200 - uriLength,asciiName,asciiNameLength);
  pvVar2 = TTDHostOpen(uriLength + asciiNameLength,(char *)&res,write);
  if (pvVar2 == (JsTTDStreamHandle)0x0) {
    pPVar1 = PAL_get_stderr(0);
    PAL_fprintf(pPVar1,"Failed to open file: %s\n",&res);
  }
  TTReportLastIOErrorAsNeeded((uint)(pvVar2 != (JsTTDStreamHandle)0x0),"Failed File Open");
  return pvVar2;
}

Assistant:

JsTTDStreamHandle CALLBACK Helpers::TTCreateStreamCallback(size_t uriLength, const char* uri, size_t asciiNameLength, const char* asciiName, bool read, bool write)
{
    AssertMsg((read | write) & (!read | !write), "Read/Write streams not supported yet -- defaulting to read only");

    if(uriLength + asciiNameLength + 1 > MAX_URI_LENGTH)
    {
        wprintf(_u("We assume bounded MAX_URI_LENGTH for simplicity."));
        exit(1);
    }

    char path[MAX_URI_LENGTH];
    memset(path, 0, MAX_URI_LENGTH);

    memcpy_s(path, MAX_URI_LENGTH, uri, uriLength);
    memcpy_s(path + uriLength, MAX_URI_LENGTH - uriLength, asciiName, asciiNameLength);

    JsTTDStreamHandle res = TTDHostOpen(uriLength + asciiNameLength, path, write);
    if(res == nullptr)
    {
        fprintf(stderr, "Failed to open file: %s\n", path);
    }

    Helpers::TTReportLastIOErrorAsNeeded(res != nullptr, "Failed File Open");
    return res;
}